

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O0

void __thiscall
BinaryEqualFailure::BinaryEqualFailure
          (BinaryEqualFailure *this,UtestShell *test,char *fileName,size_t lineNumber,
          uchar *expected,uchar *actual,size_t size,SimpleString *text)

{
  SimpleString *in_RDI;
  long in_R8;
  long in_R9;
  size_t failStart;
  DifferenceFormat in_stack_00000064;
  size_t in_stack_00000068;
  SimpleString *in_stack_00000070;
  TestFailure *in_stack_00000078;
  SimpleString *in_stack_ffffffffffffff48;
  SimpleString *in_stack_ffffffffffffff58;
  SimpleString *in_stack_ffffffffffffff60;
  TestFailure *in_stack_ffffffffffffff68;
  long local_88;
  size_t in_stack_ffffffffffffff88;
  SimpleString *in_stack_ffffffffffffff90;
  TestFailure *in_stack_ffffffffffffff98;
  TestFailure *in_stack_ffffffffffffffa0;
  
  TestFailure::TestFailure
            (in_stack_ffffffffffffffa0,(UtestShell *)in_stack_ffffffffffffff98,
             (char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  in_RDI->buffer_ = (char *)&PTR__BinaryEqualFailure_001c4d00;
  TestFailure::createUserText(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  SimpleString::operator=(in_RDI,in_stack_ffffffffffffff48);
  SimpleString::~SimpleString((SimpleString *)0x17c233);
  StringFromBinaryOrNull((uchar *)in_stack_ffffffffffffff58,(size_t)in_RDI);
  StringFromBinaryOrNull((uchar *)in_stack_ffffffffffffff58,(size_t)in_RDI);
  TestFailure::createButWasString
            (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  SimpleString::operator+=(in_RDI,in_stack_ffffffffffffff48);
  SimpleString::~SimpleString((SimpleString *)0x17c2a5);
  SimpleString::~SimpleString((SimpleString *)0x17c2af);
  SimpleString::~SimpleString((SimpleString *)0x17c2b9);
  if ((in_R8 != 0) && (in_R9 != 0)) {
    for (local_88 = 0; *(char *)(in_R9 + local_88) == *(char *)(in_R8 + local_88);
        local_88 = local_88 + 1) {
    }
    StringFromBinary((uchar *)in_stack_ffffffffffffff98,(size_t)in_stack_ffffffffffffff90);
    TestFailure::createDifferenceAtPosString
              (in_stack_00000078,in_stack_00000070,in_stack_00000068,in_stack_00000064);
    SimpleString::operator+=(in_RDI,in_stack_ffffffffffffff48);
    SimpleString::~SimpleString((SimpleString *)0x17c3f9);
    SimpleString::~SimpleString((SimpleString *)0x17c403);
  }
  return;
}

Assistant:

BinaryEqualFailure::BinaryEqualFailure(UtestShell* test, const char* fileName, size_t lineNumber, const unsigned char* expected,
                                       const unsigned char* actual, size_t size, const SimpleString& text)
: TestFailure(test, fileName, lineNumber)
{
    message_ = createUserText(text);

	message_ += createButWasString(StringFromBinaryOrNull(expected, size), StringFromBinaryOrNull(actual, size));
	if ((expected) && (actual))
	{
		size_t failStart;
		for (failStart = 0; actual[failStart] == expected[failStart]; failStart++)
			;
		message_ += createDifferenceAtPosString(StringFromBinary(actual, size), failStart, DIFFERENCE_BINARY);
	}
}